

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChargeHistogram.cpp
# Opt level: O3

void __thiscall OpenMD::ChargeHistogram::process(ChargeHistogram *this)

{
  AtomType *pAVar1;
  iterator iVar2;
  pointer pdVar3;
  pointer pdVar4;
  bool bVar5;
  int iVar6;
  StuntDouble *pSVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  int whichFrame;
  double *pdVar11;
  RealType RVar12;
  undefined1 auVar13 [16];
  double dVar14;
  RealType min;
  FixedChargeAdapter fca;
  vector<double,_std::allocator<double>_> charge;
  FluctuatingChargeAdapter fqa;
  int ii;
  DumpReader reader;
  double local_12e0;
  ChargeHistogram *local_12d8;
  FixedChargeAdapter local_12d0;
  double *local_12c8;
  iterator iStack_12c0;
  double *local_12b8;
  double local_12a8;
  int local_129c;
  FluctuatingChargeAdapter local_1298;
  int local_128c;
  DumpReader local_1288;
  
  if ((this->evaluator_).isDynamic_ == true) {
    SelectionEvaluator::evaluate((SelectionSet *)&local_1288,&this->evaluator_);
    lVar10 = 0;
    do {
      std::vector<bool,_std::allocator<bool>_>::operator=
                ((vector<bool,_std::allocator<bool>_> *)
                 ((long)&(((this->seleMan_).ss_.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                         super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                         ._M_start.super__Bit_iterator_base._M_p + lVar10),
                 (vector<bool,_std::allocator<bool>_> *)
                 ((long)&(local_1288.info_)->_vptr_SimInfo + lVar10));
      lVar10 = lVar10 + 0x28;
    } while (lVar10 != 0xf0);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)&local_1288);
  }
  DumpReader::DumpReader
            (&local_1288,(this->super_StaticAnalyser).info_,
             &(this->super_StaticAnalyser).dumpFilename_);
  iVar6 = DumpReader::getNFrames(&local_1288);
  local_12c8 = (double *)0x0;
  iStack_12c0._M_current = (double *)0x0;
  local_12b8 = (double *)0x0;
  this->nProcessed_ = iVar6 / (this->super_StaticAnalyser).step_;
  if (0 < iVar6) {
    whichFrame = 0;
    local_12d8 = this;
    local_129c = iVar6;
    do {
      local_12a8 = (double)CONCAT44(local_12a8._4_4_,whichFrame);
      DumpReader::readFrame(&local_1288,whichFrame);
      local_12d8->currentSnapshot_ =
           ((local_12d8->super_StaticAnalyser).info_)->sman_->currentSnapshot_;
      pSVar7 = SelectionManager::beginSelected(&this->seleMan_,&local_128c);
      while (pSVar7 != (StuntDouble *)0x0) {
        local_12e0 = 0.0;
        pAVar1 = (AtomType *)pSVar7[1]._vptr_StuntDouble;
        local_12d0.at_ = pAVar1;
        bVar5 = FixedChargeAdapter::isFixedCharge(&local_12d0);
        if (bVar5) {
          RVar12 = FixedChargeAdapter::getCharge(&local_12d0);
          local_12e0 = RVar12 + local_12e0;
        }
        local_1298.at_ = pAVar1;
        bVar5 = FluctuatingChargeAdapter::isFluctuatingCharge(&local_1298);
        if (bVar5) {
          local_12e0 = *(double *)
                        (*(long *)((long)&(pSVar7->snapshotMan_->currentSnapshot_->atomData).
                                          flucQPos.
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_start +
                                  pSVar7->storage_) + (long)pSVar7->localIndex_ * 8) + local_12e0;
        }
        if (iStack_12c0._M_current == local_12b8) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    ((vector<double,std::allocator<double>> *)&local_12c8,iStack_12c0,&local_12e0);
        }
        else {
          *iStack_12c0._M_current = local_12e0;
          iStack_12c0._M_current = iStack_12c0._M_current + 1;
        }
        pSVar7 = SelectionManager::nextSelected(&this->seleMan_,&local_128c);
      }
      whichFrame = local_12a8._0_4_ + (local_12d8->super_StaticAnalyser).step_;
    } while (whichFrame < local_129c);
    this = local_12d8;
    if (local_12c8 != iStack_12c0._M_current) goto LAB_0018f322;
  }
  builtin_strncpy(painCave.errMsg + 0x10,"t found.\n",10);
  builtin_strncpy(painCave.errMsg,"Selected atom no",0x10);
  painCave.isFatal = 1;
  simError();
LAB_0018f322:
  iVar2._M_current = iStack_12c0._M_current;
  pdVar11 = local_12c8;
  if (local_12c8 != iStack_12c0._M_current) {
    uVar8 = (long)iStack_12c0._M_current - (long)local_12c8 >> 3;
    lVar10 = 0x3f;
    if (uVar8 != 0) {
      for (; uVar8 >> lVar10 == 0; lVar10 = lVar10 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_12c8,iStack_12c0._M_current,((uint)lVar10 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pdVar11,iVar2._M_current);
  }
  local_12e0 = *local_12c8;
  dVar14 = (iStack_12c0._M_current[-1] - local_12e0) / (double)this->nBins_;
  local_12d8 = (ChargeHistogram *)local_12e0;
  if ((dVar14 != 0.0) || (NAN(dVar14))) {
    if (-3 < this->nBins_) {
      iVar6 = -1;
      local_12a8 = dVar14;
      do {
        local_12d0.at_ = (AtomType *)((double)iVar6 * local_12a8 + (double)local_12d8);
        iVar2._M_current =
             (this->bincenter_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (this->bincenter_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (&this->bincenter_,iVar2,(double *)&local_12d0);
        }
        else {
          *iVar2._M_current = (double)local_12d0.at_;
          (this->bincenter_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar2._M_current + 1;
        }
        local_12d0.at_ = (AtomType *)0x0;
        iVar2._M_current =
             (this->histList_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (this->histList_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (&this->histList_,iVar2,(double *)&local_12d0);
        }
        else {
          *iVar2._M_current = 0.0;
          (this->histList_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar2._M_current + 1;
        }
        iVar6 = iVar6 + 1;
      } while (iVar6 < this->nBins_ + 2);
    }
    if (local_12c8 < iStack_12c0._M_current) {
      lVar10 = (long)iStack_12c0._M_current - (long)local_12c8 >> 3;
      auVar13._8_4_ = (int)((long)iStack_12c0._M_current - (long)local_12c8 >> 0x23);
      auVar13._0_8_ = lVar10;
      auVar13._12_4_ = 0x45300000;
      pdVar3 = (this->bincenter_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar9 = 0;
      pdVar11 = local_12c8;
      do {
        pdVar4 = (this->histList_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        for (lVar9 = (long)(int)lVar9; (*pdVar11 < pdVar3[lVar9] || (pdVar3[lVar9 + 1] <= *pdVar11))
            ; lVar9 = lVar9 + 1) {
        }
        pdVar4[lVar9] =
             pdVar4[lVar9] +
             1.0 / ((auVar13._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)lVar10) - 4503599627370496.0));
        pdVar11 = pdVar11 + 1;
      } while (pdVar11 < iStack_12c0._M_current);
    }
  }
  else {
    iVar2._M_current =
         (this->bincenter_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (this->bincenter_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                ((vector<double,std::allocator<double>> *)&this->bincenter_,iVar2,&local_12e0);
    }
    else {
      *iVar2._M_current = local_12e0;
      (this->bincenter_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar2._M_current + 1;
    }
    local_12d0.at_ = (AtomType *)0x3ff0000000000000;
    iVar2._M_current =
         (this->histList_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (this->histList_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                (&this->histList_,iVar2,(double *)&local_12d0);
    }
    else {
      *iVar2._M_current = 1.0;
      (this->histList_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar2._M_current + 1;
    }
  }
  (*(this->super_StaticAnalyser)._vptr_StaticAnalyser[4])(this);
  if (local_12c8 != (double *)0x0) {
    operator_delete(local_12c8,(long)local_12b8 - (long)local_12c8);
  }
  DumpReader::~DumpReader(&local_1288);
  return;
}

Assistant:

void ChargeHistogram::process() {
    StuntDouble* sd;
    int ii;

    if (evaluator_.isDynamic()) {
      seleMan_.setSelectionSet(evaluator_.evaluate());
    }

    DumpReader reader(info_, dumpFilename_);
    int nFrames = reader.getNFrames();
    nProcessed_ = nFrames / step_;
    vector<RealType> charge;

    nProcessed_ = nFrames / step_;

    for (int istep = 0; istep < nFrames; istep += step_) {
      reader.readFrame(istep);
      currentSnapshot_ = info_->getSnapshotManager()->getCurrentSnapshot();

      for (sd = seleMan_.beginSelected(ii); sd != NULL;
           sd = seleMan_.nextSelected(ii)) {
        RealType q = 0.0;
        Atom* atom = static_cast<Atom*>(sd);

        AtomType* atomType = atom->getAtomType();

        FixedChargeAdapter fca = FixedChargeAdapter(atomType);
        if (fca.isFixedCharge()) { q += fca.getCharge(); }

        FluctuatingChargeAdapter fqa = FluctuatingChargeAdapter(atomType);
        if (fqa.isFluctuatingCharge()) { q += atom->getFlucQPos(); }

        charge.push_back(q);
      }
    }

    if (charge.empty()) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "Selected atom not found.\n");
      painCave.isFatal = 1;
      simError();
    }

    std::sort(charge.begin(), charge.end());

    RealType min = charge.front();
    RealType max = charge.back();

    RealType delta_charge = (max - min) / (nBins_);

    if (delta_charge == 0) {
      bincenter_.push_back(min);
      histList_.push_back(1);
    } else {
      // fill the center for histogram
      for (int j = 0; j < nBins_ + 3; ++j) {
        bincenter_.push_back(min + (j - 1) * delta_charge);
        histList_.push_back(0);
      }
      // filling up the histogram whith the densities
      int bin_center_pos = 0;
      vector<RealType>::iterator index;
      RealType charge_length = static_cast<RealType>(charge.size());

      bool hist_update;
      for (index = charge.begin(); index < charge.end(); index++) {
        hist_update = true;
        while (hist_update) {
          if (*index >= bincenter_[bin_center_pos] &&
              *index < bincenter_[bin_center_pos + 1]) {
            histList_[bin_center_pos] += 1.0 / charge_length;
            hist_update = false;
          } else {
            bin_center_pos++;
            hist_update = true;
          }
        }
      }
    }
    writeCharge();
  }